

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unigram_model.cc
# Opt level: O0

void __thiscall sentencepiece::unigram::Model::Model(Model *this,ModelProto *model_proto)

{
  bool bVar1;
  ModelProto_SentencePiece_Type MVar2;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int> *it;
  iterator __end2_1;
  iterator __begin2_1;
  PieceToIdMap *__range2_1;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  pieces;
  ModelProto_SentencePiece *sp;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *__range2;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_00000108;
  Model *in_stack_00000110;
  ModelInterface *in_stack_000002f0;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_ffffffffffffff18;
  unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
  *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff2c;
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_78;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_70;
  undefined8 *local_68;
  float local_48;
  float local_44;
  reference local_40;
  iterator local_38;
  RepeatedPtrIterator<const_sentencepiece::ModelProto_SentencePiece> local_30;
  RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *local_28;
  undefined8 local_10;
  
  local_10 = in_RSI;
  ModelInterface::ModelInterface
            ((ModelInterface *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  *in_RDI = &PTR__Model_006f1658;
  *(undefined4 *)(in_RDI + 0x13) = 0;
  *(undefined4 *)((long)in_RDI + 0x9c) = 0;
  std::
  unique_ptr<Darts::DoubleArrayImpl<void,void,int,void>,std::default_delete<Darts::DoubleArrayImpl<void,void,int,void>>>
  ::unique_ptr<std::default_delete<Darts::DoubleArrayImpl<void,void,int,void>>,void>
            (in_stack_ffffffffffffff20);
  *(undefined4 *)((long)in_RDI + 0xac) = 0;
  in_RDI[1] = local_10;
  ModelInterface::InitializePieces(in_stack_000002f0);
  *(undefined4 *)(in_RDI + 0x13) = 0x7f7fffff;
  *(undefined4 *)((long)in_RDI + 0x9c) = 0x800000;
  local_28 = ModelProto::pieces((ModelProto *)in_RDI[1]);
  local_30.it_ = (void **)google::protobuf::
                          RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::begin
                                    ((RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *)
                                     in_stack_ffffffffffffff18);
  local_38.it_ = (void **)google::protobuf::
                          RepeatedPtrField<sentencepiece::ModelProto_SentencePiece>::end
                                    ((RepeatedPtrField<sentencepiece::ModelProto_SentencePiece> *)
                                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  while( true ) {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_sentencepiece::ModelProto_SentencePiece>::operator!=
                      (&local_30,&local_38);
    if (!bVar1) break;
    local_40 = google::protobuf::internal::
               RepeatedPtrIterator<const_sentencepiece::ModelProto_SentencePiece>::operator*
                         (&local_30);
    MVar2 = ModelProto_SentencePiece::type((ModelProto_SentencePiece *)0x482921);
    if (MVar2 == ModelProto_SentencePiece_Type_NORMAL) {
      local_44 = ModelProto_SentencePiece::score((ModelProto_SentencePiece *)0x482951);
      in_stack_ffffffffffffff30 =
           (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            *)std::min<float>((float *)(in_RDI + 0x13),&local_44);
      *(float *)(in_RDI + 0x13) =
           *(float *)&(in_stack_ffffffffffffff30->
                      super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
      in_stack_ffffffffffffff20 =
           (unique_ptr<Darts::DoubleArrayImpl<void,_void,_int,_void>,_std::default_delete<Darts::DoubleArrayImpl<void,_void,_int,_void>_>_>
            *)((long)in_RDI + 0x9c);
      in_stack_ffffffffffffff2c =
           ModelProto_SentencePiece::score((ModelProto_SentencePiece *)0x4829af);
      local_48 = in_stack_ffffffffffffff2c;
      in_stack_ffffffffffffff18 =
           (unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            *)std::max<float>((float *)in_stack_ffffffffffffff20,&local_48);
      *(float *)((long)in_RDI + 0x9c) = *(float *)&(in_stack_ffffffffffffff18->_M_h)._M_buckets;
    }
    google::protobuf::internal::RepeatedPtrIterator<const_sentencepiece::ModelProto_SentencePiece>::
    operator++(&local_30);
  }
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
            *)0x482a31);
  local_68 = in_RDI + 3;
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::begin(in_stack_ffffffffffffff18);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_70,&local_78);
    if (!bVar1) break;
    std::__detail::
    _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
    ::operator*((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
                 *)0x482a85);
    std::
    vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,int>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,int_const&>
              (in_stack_ffffffffffffff30,
               (basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               (int *)in_stack_ffffffffffffff20);
    std::__detail::
    _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
    ::operator++((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
                  *)in_stack_ffffffffffffff20);
  }
  BuildTrie(in_stack_00000110,in_stack_00000108);
  std::
  vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~vector(in_stack_ffffffffffffff30);
  return;
}

Assistant:

Model::Model(const ModelProto &model_proto) {
  model_proto_ = &model_proto;

  InitializePieces();

  min_score_ = FLT_MAX;
  max_score_ = FLT_MIN;
  for (const auto &sp : model_proto_->pieces()) {
    if (sp.type() == ModelProto::SentencePiece::NORMAL) {
      min_score_ = std::min(min_score_, sp.score());
      max_score_ = std::max(max_score_, sp.score());
    }
  }

  std::vector<std::pair<absl::string_view, int>> pieces;
  for (const auto &it : pieces_) pieces.emplace_back(it.first, it.second);

  BuildTrie(&pieces);
}